

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode UA_SessionManager_removeSession(UA_SessionManager *sm,UA_NodeId *token)

{
  UA_Boolean UVar1;
  UA_StatusCode UVar2;
  session_list_entry *sentry;
  
  sentry = (session_list_entry *)sm;
  do {
    sentry = (sentry->pointers).le_next;
    if (sentry == (session_list_entry *)0x0) {
      return 0x80250000;
    }
    UVar1 = UA_NodeId_equal(&(sentry->session).authenticationToken,token);
  } while (!UVar1);
  UVar2 = removeSession(sm,sentry);
  return UVar2;
}

Assistant:

UA_StatusCode
UA_SessionManager_removeSession(UA_SessionManager *sm, const UA_NodeId *token) {
    session_list_entry *current;
    LIST_FOREACH(current, &sm->sessions, pointers) {
        if(UA_NodeId_equal(&current->session.authenticationToken, token))
            break;
    }
    if(!current)
        return UA_STATUSCODE_BADSESSIONIDINVALID;
    return removeSession(sm, current);
}